

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  size_t __size;
  char *__ptr;
  int broadcastEnable;
  timeval tv;
  fd_set fds;
  undefined4 local_cc;
  timeval local_c8;
  fd_set local_b8;
  
  signal(2,on_signal_close);
  signal(0xf,on_signal_close);
  flag_root = true;
  global_map_id = 0;
  buf = malloc(1000000);
  while( true ) {
    while( true ) {
      iVar2 = getopt(argc,argv,"p:l:m:");
      if (iVar2 < 0x6d) break;
      if (iVar2 == 0x6d) {
        iVar2 = atoi(_optarg);
        my_port = (unsigned_short)iVar2;
      }
      else {
        if (iVar2 != 0x70) goto LAB_00103f13;
        fwrite("CCCCCCCCCCCCCCCCCCCCCCCC\n",0x19,1,_stderr);
        flag_root = false;
        parse_parent_address(_optarg);
      }
    }
    if (iVar2 != 0x6c) break;
    precent_lose = atoi(_optarg);
  }
  if (iVar2 == -1) {
    if (my_port != 0) {
      fwrite("AAAAAAAAAAAAAAAAAAAAAAAAA\n",0x1a,1,_stderr);
      socket_fd = socket(2,2,0);
      local_cc = 1;
      setsockopt(socket_fd,1,6,&local_cc,4);
      bzero(&my_addr,0x10);
      my_addr.sin_port = my_port << 8 | my_port >> 8;
      my_addr.sin_family = 2;
      my_addr.sin_addr.s_addr = 0;
      iVar2 = bind(socket_fd,(sockaddr *)&my_addr,0x10);
      if (-1 < iVar2) {
        do_express_myself();
        do {
          iVar2 = fileno(_stdin);
          local_b8.fds_bits[0] = 0;
          local_b8.fds_bits[1] = 0;
          local_b8.fds_bits[2] = 0;
          local_b8.fds_bits[3] = 0;
          local_b8.fds_bits[4] = 0;
          local_b8.fds_bits[5] = 0;
          local_b8.fds_bits[6] = 0;
          local_b8.fds_bits[7] = 0;
          local_b8.fds_bits[8] = 0;
          local_b8.fds_bits[9] = 0;
          local_b8.fds_bits[10] = 0;
          local_b8.fds_bits[0xb] = 0;
          if (iVar2 <= socket_fd) {
            iVar2 = socket_fd;
          }
          iVar5 = socket_fd + 0x3f;
          if (-1 < socket_fd) {
            iVar5 = socket_fd;
          }
          local_b8.fds_bits[0xc] = 0;
          local_b8.fds_bits[0xd] = 0;
          local_b8.fds_bits[0xe] = 0;
          local_b8.fds_bits[0xf] = 0;
          local_b8.fds_bits[iVar5 >> 6] =
               local_b8.fds_bits[iVar5 >> 6] | 1L << ((byte)socket_fd & 0x3f);
          iVar3 = fileno(_stdin);
          iVar4 = fileno(_stdin);
          iVar5 = iVar4 + 0x3f;
          if (-1 < iVar4) {
            iVar5 = iVar4;
          }
          local_b8.fds_bits[iVar5 >> 6] = local_b8.fds_bits[iVar5 >> 6] | 1L << ((byte)iVar3 & 0x3f)
          ;
          local_c8.tv_sec = 0;
          local_c8.tv_usec = 500000;
          iVar2 = select(iVar2 + 1,&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_c8);
          if (-1 < iVar2) {
            lVar7 = std::chrono::_V2::system_clock::now();
            check_and_resend(lVar7 / 1000);
            iVar5 = fileno(_stdin);
            iVar2 = iVar5 + 0x3f;
            if (-1 < iVar5) {
              iVar2 = iVar5;
            }
            uVar1 = local_b8.fds_bits[iVar2 >> 6];
            uVar6 = fileno(_stdin);
            if ((uVar1 >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
              read_message_from_console();
            }
            iVar2 = socket_fd + 0x3f;
            if (-1 < socket_fd) {
              iVar2 = socket_fd;
            }
            if (((ulong)local_b8.fds_bits[iVar2 >> 6] >> ((ulong)(uint)socket_fd & 0x3f) & 1) != 0)
            {
              recv_message();
            }
          }
        } while( true );
      }
      perror("Bind");
      goto LAB_00103f2d;
    }
    __ptr = "No port\n";
    __size = 8;
  }
  else {
LAB_00103f13:
    __ptr = "Unknown argument\n";
    __size = 0x11;
  }
  fwrite(__ptr,__size,1,_stderr);
LAB_00103f2d:
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {
    signal(SIGINT, on_signal_close);
    signal(SIGTERM, on_signal_close);

    init_globals();

    int opt = 0;
    while ((opt = getopt(argc, argv, "p:l:m:")) != -1) {
        switch (opt) {
            case 'p':
                fprintf(stderr, "CCCCCCCCCCCCCCCCCCCCCCCC\n");
                flag_root = false;
                parse_parent_address(optarg);
                break;
            case 'l':
                precent_lose = atoi(optarg);
                break;
            case 'm':
                my_port = (unsigned short)atoi(optarg);
                break;
            default:
                fprintf(stderr, "Unknown argument\n");
                exit(EXIT_FAILURE);
        }
    }
    if (!my_port) {
        fprintf(stderr, "No port\n");
        exit(EXIT_FAILURE);
    }
    fprintf(stderr, "AAAAAAAAAAAAAAAAAAAAAAAAA\n");

    socket_fd = socket(PF_INET, SOCK_DGRAM, 0);
    int broadcastEnable = 1;
    setsockopt(socket_fd, SOL_SOCKET, SO_BROADCAST, &broadcastEnable, sizeof(broadcastEnable));
    bzero(&my_addr, sizeof(struct sockaddr_in));
    my_addr.sin_family = PF_INET;
    my_addr.sin_port = htons(my_port);
    my_addr.sin_addr.s_addr = htonl(INADDR_ANY);
    if (bind(socket_fd, (struct sockaddr *)&my_addr, sizeof(struct sockaddr_in)) < 0) {
        perror("Bind");
        exit(EXIT_FAILURE);
    }

    do_express_myself();

    bool flag_main_cycle = true;
    while (flag_main_cycle) {
        fd_set fds;
        int max_fd = std::max(fileno(stdin), socket_fd);
        FD_ZERO(&fds);
        FD_SET(socket_fd, &fds);
        FD_SET(fileno(stdin), &fds);

        struct timeval tv = {0, SENDING_INTERVAL / 2};
        int activity = select(max_fd + 1, &fds, 0, 0, &tv);
        if (activity < 0) {
            continue;
        }
        /*if (activity) {
            fprintf(stderr, "Activity: %d\n", activity);
        }*/

        auto cur_time = std::chrono::high_resolution_clock::now().time_since_epoch();
        check_and_resend(std::chrono::duration_cast<std::chrono::microseconds>(cur_time).count());

        if (FD_ISSET(fileno(stdin), &fds)) {
            read_message_from_console();
        }

        if (FD_ISSET(socket_fd, &fds)) {
            //fprintf(stderr, "!!! On socket\n");
            recv_message();
        }
        //recv_message();
    }

    final_function();
    return 0;
}